

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

longlong __thiscall Graph::solve(Graph *this)

{
  uint uVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer piVar4;
  pointer piVar5;
  longlong lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  longlong *plVar10;
  ulong uVar11;
  int j;
  long lVar12;
  pointer piStack_40;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> temp;
  
  piStack_40 = (pointer)0x1028fe;
  ts((vector<int,_std::allocator<int>_> *)local_38,this);
  lVar12 = -((ulong)(uint)this->size * 8 + 0xf & 0xfffffffffffffff0);
  plVar10 = (longlong *)(local_38 + lVar12);
  uVar1 = this->size;
  uVar8 = 0;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    plVar10[uVar8] = 0;
  }
  *(undefined8 *)((long)&piStack_40 + (long)(int)uVar1 * 8 + lVar12) = 1;
  pvVar3 = this->adjacencyVector;
  uVar8 = (ulong)((long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start - (long)local_38) >> 2 & 0xffffffff;
  while( true ) {
    uVar8 = uVar8 - 1;
    if ((int)(uint)uVar8 < 0) break;
    iVar2 = *(int *)((long)local_38 + (ulong)((uint)uVar8 & 0x7fffffff) * 4);
    piVar4 = pvVar3[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = pvVar3[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar12 = 0; (long)piVar5 - (long)piVar4 >> 2 != lVar12; lVar12 = lVar12 + 1) {
      lVar9 = (plVar10[piVar4[lVar12]] % 0x3b9aca07 + plVar10[iVar2]) % 0x3b9aca07;
      lVar7 = lVar9 + 0x3b9aca07;
      if (-1 < lVar9) {
        lVar7 = lVar9;
      }
      plVar10[iVar2] = lVar7;
    }
  }
  lVar6 = *plVar10;
  piStack_40 = (pointer)0x1029c8;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_38);
  return lVar6;
}

Assistant:

long long Graph::solve() {
    vector<int> temp = ts();
    long long result[this->size];
    for (int k = 0; k < this->size; ++k) {
        result[k]=0;
    }
    result[this->size-1] = 1;
    for (int i = temp.size() - 1; i >= 0; i--) {
        for (int j = 0; j < adjacencyVector[temp[i]].size(); j++) {
            result[temp[i]] += (result[adjacencyVector[temp[i]][j]]%1000000007);
            result[temp[i]]%=1000000007;
            if(result[temp[i]]<0){
                result[temp[i]]+=1000000007;
            }
        }
    }
    return result[0];
}